

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O0

Matrix3d * ear::calcBasis(Matrix3d *__return_storage_ptr__,Vector3d *position)

{
  Vector3d *position_00;
  double extraout_XMM0_Qa;
  Matrix<double,_3,_1,_0,_3,_1> local_88;
  double local_70;
  double el;
  double local_50;
  double az;
  Vector3d local_30;
  Vector3d *local_18;
  Vector3d *position_local;
  
  local_18 = position;
  position_local = (Vector3d *)__return_storage_ptr__;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)&az,position);
  anon_unknown_0::safeNormPosition(&local_30,(Vector3d *)&az);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=(position,&local_30);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)&el,position);
  local_50 = azimuth((Vector3d *)&el);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_88,position);
  position_00 = &local_88;
  local_70 = elevation(position_00);
  std::abs((int)position_00);
  if (89.99999 < extraout_XMM0_Qa) {
    local_50 = 0.0;
  }
  localCoordinateSystem(__return_storage_ptr__,local_50,local_70);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d calcBasis(Eigen::Vector3d position) {
    position = safeNormPosition(position);
    double az = azimuth(position);
    double el = elevation(position);

    // points near the poles have indeterminate azimuth; assume 0
    if (std::abs(el) > (90.0 - 1e-5)) {
      az = 0.0;
    }
    return localCoordinateSystem(az, el);
  }